

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLayerComparer::operator()
          (ImageLayerComparer *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  TextureType TVar1;
  ChannelType CVar2;
  LayeredImage *this_00;
  bool bVar3;
  deUint32 value;
  char *__s;
  string comparisonDesc;
  string comparisonName;
  ConstPixelBufferAccess referenceSlice;
  int local_f0;
  allocator<char> local_e9;
  ConstPixelBufferAccess local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  this_00 = this->m_reference;
  TVar1 = this_00->m_type;
  local_f0 = sliceOrFaceNdx;
  if (TVar1 == TEXTURETYPE_CUBE) {
    LayeredImage::getCubeFaceAccess
              (&local_e8,this_00,
               (&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)
               [sliceOrFaceNdx]);
  }
  else {
    LayeredImage::getSliceAccessInternal((PixelBufferAccess *)&local_80,this_00,sliceOrFaceNdx);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_e8,&local_80);
  }
  tcu::getSubregion(&local_58,&local_e8,0,0,(this->m_relevantRegion).m_data[0],
                    (this->m_relevantRegion).m_data[1]);
  de::toString<int>((string *)&local_e8,&local_f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                 "Comparison",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (TVar1 == TEXTURETYPE_CUBE) {
    value = cubeFaceToGLFace((&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::
                               faces)[local_f0]);
    __s = glu::getCubeMapFaceName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_e9);
    std::operator+(&local_a0,"face ",&local_c0);
  }
  else {
    de::toString<int>(&local_c0,&local_f0);
    std::operator+(&local_a0,"slice ",&local_c0);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8,
                 "Image Comparison, ",&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  CVar2 = (this->m_reference->m_format).type;
  if ((((ulong)CVar2 < 0x22) && ((0x2c0000000U >> ((ulong)CVar2 & 0x3f) & 1) != 0)) ||
     (CVar2 - SIGNED_INT8 < 3)) {
    tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&local_a0,0);
    bVar3 = tcu::intThresholdCompare
                      (log,(char *)local_80.m_format,(char *)local_e8.m_format,&local_58,resultSlice
                       ,(UVec4 *)&local_a0,COMPARE_LOG_RESULT);
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_a0,0.01);
    bVar3 = tcu::floatThresholdCompare
                      (log,(char *)local_80.m_format,(char *)local_e8.m_format,&local_58,resultSlice
                       ,(Vec4 *)&local_a0,COMPARE_LOG_RESULT);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_80);
  return bVar3;
}

Assistant:

bool operator() (TestLog& log, const tcu::ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool						isCube				= m_reference.getImageType() == TEXTURETYPE_CUBE;
		const ConstPixelBufferAccess	referenceSlice		= tcu::getSubregion(isCube ? m_reference.getCubeFaceAccess(glslImageFuncZToCubeFace(sliceOrFaceNdx))
																					   : m_reference.getSliceAccess(sliceOrFaceNdx),
																				0, 0, m_relevantRegion.x(), m_relevantRegion.y());

		const string comparisonName = "Comparison" + toString(sliceOrFaceNdx);
		const string comparisonDesc = "Image Comparison, "
									+ (isCube ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
											  : "slice " + toString(sliceOrFaceNdx));

		if (isFormatTypeInteger(m_reference.getFormat().type))
			return tcu::intThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), referenceSlice, resultSlice, UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			return tcu::floatThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), referenceSlice, resultSlice, Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
	}